

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall
SQVM::ArithMetaMethod(SQVM *this,SQInteger op,SQObjectPtr *o1,SQObjectPtr *o2,SQObjectPtr *dest)

{
  SQTable *pSVar1;
  int iVar2;
  SQChar *pSVar3;
  SQChar *pSVar4;
  SQMetaMethod mm;
  undefined8 uVar5;
  byte unaff_R13B;
  SQObjectPtr closure;
  SQObject local_48;
  SQObjectPtr *local_38;
  
  uVar5 = 0;
  if (op < 0x2d) {
    if (op == 0x25) {
      uVar5 = 5;
    }
    else if (op == 0x2a) {
      uVar5 = 2;
    }
  }
  else if (op == 0x2f) {
    uVar5 = 3;
  }
  else if (op == 0x2d) {
    uVar5 = 1;
  }
  if ((((o1->super_SQObject)._type & 0x2000000) != 0) &&
     (pSVar1 = (o1->super_SQObject)._unVal.pTable,
     (pSVar1->super_SQDelegable)._delegate != (SQTable *)0x0)) {
    local_48._unVal.pTable = (SQTable *)0x0;
    local_48._type = OT_NULL;
    local_48._flags = '\0';
    local_48._5_3_ = 0;
    local_38 = dest;
    iVar2 = (*(pSVar1->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [6])(pSVar1,this,uVar5);
    if ((char)iVar2 != '\0') {
      Push(this,o1);
      Push(this,o2);
      unaff_R13B = CallMetaMethod(this,(SQObjectPtr *)&local_48,mm,2,local_38);
    }
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_48);
    if ((char)iVar2 != '\0') goto LAB_00140f1f;
  }
  pSVar3 = GetTypeName(o1);
  pSVar4 = GetTypeName(o2);
  unaff_R13B = 0;
  Raise_Error(this,"arith op %c on between \'%s\' and \'%s\'",(ulong)(uint)(int)(char)op,pSVar3,
              pSVar4);
LAB_00140f1f:
  return (bool)(unaff_R13B & 1);
}

Assistant:

bool SQVM::ArithMetaMethod(SQInteger op,const SQObjectPtr &o1,const SQObjectPtr &o2,SQObjectPtr &dest)
{
    SQMetaMethod mm;
    switch(op){
        case _SC('+'): mm=MT_ADD; break;
        case _SC('-'): mm=MT_SUB; break;
        case _SC('/'): mm=MT_DIV; break;
        case _SC('*'): mm=MT_MUL; break;
        case _SC('%'): mm=MT_MODULO; break;
        default: mm = MT_ADD; assert(0); break; //shutup compiler
    }
    if(is_delegable(o1) && _delegable(o1)->_delegate) {

        SQObjectPtr closure;
        if(_delegable(o1)->GetMetaMethod(this, mm, closure)) {
            Push(o1);Push(o2);
            return CallMetaMethod(closure,mm,2,dest);
        }
    }
    Raise_Error(_SC("arith op %c on between '%s' and '%s'"),(char)op,GetTypeName(o1),GetTypeName(o2));
    return false;
}